

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  Btree *p;
  BtShared *pBt;
  BtCursor *pBVar1;
  int in_EAX;
  int extraout_EAX;
  BtCursor *pBVar2;
  BtCursor **ppBVar3;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBt = pCur->pBt;
    sqlite3BtreeEnter(p);
    pBVar2 = pBt->pCursor;
    if (pBt->pCursor == pCur) {
      ppBVar3 = &pBt->pCursor;
LAB_00163b58:
      *ppBVar3 = pCur->pNext;
    }
    else {
      do {
        pBVar1 = pBVar2->pNext;
        if (pBVar1 == pCur) {
          ppBVar3 = &pBVar2->pNext;
          goto LAB_00163b58;
        }
        pBVar2 = pBVar1;
      } while (pBVar1 != (BtCursor *)0x0);
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    sqlite3BtreeLeave(p);
    pCur->pBtree = (Btree *)0x0;
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    sqlite3BtreeLeave(pBtree);
    pCur->pBtree = 0;
  }
  return SQLITE_OK;
}